

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<InlinedVector<basic_string<char>,_4>_>::value_&&_HasData<InlinedVector<basic_string<char>,_4>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *v)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  std::operator<<(os,"[ ");
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v->field_2;
  if (v->ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar3 = v->ptr;
  }
  for (uVar2 = 0; uVar2 < v->nStored; uVar2 = uVar2 + 1) {
    std::operator<<(os,(string *)pbVar3);
    if (uVar2 < v->nStored - 1) {
      std::operator<<(os,", ");
    }
    pbVar3 = pbVar3 + 1;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}